

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void print_summary(OSQPWorkspace *work)

{
  ulong *puVar1;
  long in_RDI;
  OSQPInfo *info;
  
  puVar1 = *(ulong **)(in_RDI + 0xd0);
  printf("%4i",*puVar1 & 0xffffffff);
  printf(" %12.4e",puVar1[7]);
  printf("  %9.2e",puVar1[8]);
  printf("  %9.2e",puVar1[9]);
  printf("  %9.2e",**(undefined8 **)(in_RDI + 0xb8));
  if (*(long *)(in_RDI + 0xe0) == 0) {
    printf("  %9.2es",(double)puVar1[0xc] + (double)puVar1[0xb]);
  }
  else {
    printf("  %9.2es",(double)puVar1[10] + (double)puVar1[0xb]);
  }
  printf("\n");
  *(undefined8 *)(in_RDI + 0xf8) = 1;
  return;
}

Assistant:

void print_summary(OSQPWorkspace *work) {
  OSQPInfo *info;

  info = work->info;

  c_print("%4i",     (int)info->iter);
  c_print(" %12.4e", info->obj_val);
  c_print("  %9.2e", info->pri_res);
  c_print("  %9.2e", info->dua_res);
  c_print("  %9.2e", work->settings->rho);
# ifdef PROFILING

  if (work->first_run) {
    // total time: setup + solve
    c_print("  %9.2es", info->setup_time + info->solve_time);
  } else {
    // total time: update + solve
    c_print("  %9.2es", info->update_time + info->solve_time);
  }
# endif /* ifdef PROFILING */
  c_print("\n");

  work->summary_printed = 1; // Summary has been printed
}